

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O3

void HistoryItemMove(pyhanabi_history_item_t *item,pyhanabi_move_t *move)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  
  if (item == (pyhanabi_history_item_t *)0x0) {
    __assert_fail("item != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0xd9,"void HistoryItemMove(pyhanabi_history_item_t *, pyhanabi_move_t *)");
  }
  puVar1 = (undefined8 *)item->item;
  if (puVar1 != (undefined8 *)0x0) {
    if (move != (pyhanabi_move_t *)0x0) {
      puVar2 = (undefined8 *)operator_new(8);
      *puVar2 = *puVar1;
      move->move = puVar2;
      return;
    }
    __assert_fail("move != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0xdb,"void HistoryItemMove(pyhanabi_history_item_t *, pyhanabi_move_t *)");
  }
  __assert_fail("item->item != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0xda,"void HistoryItemMove(pyhanabi_history_item_t *, pyhanabi_move_t *)");
}

Assistant:

void HistoryItemMove(pyhanabi_history_item_t* item, pyhanabi_move_t* move) {
  REQUIRE(item != nullptr);
  REQUIRE(item->item != nullptr);
  REQUIRE(move != nullptr);
  move->move = new hanabi_learning_env::HanabiMove(
      reinterpret_cast<const hanabi_learning_env::HanabiHistoryItem*>(
          item->item)
          ->move);
}